

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall
kratos::VarExtend::VarExtend(VarExtend *this,shared_ptr<kratos::Var> *var,uint32_t width)

{
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  undefined4 uVar1;
  bool bVar2;
  uint uVar3;
  VarType VVar4;
  element_type *peVar5;
  VarException *this_00;
  bool *pbVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar7;
  size_type sVar8;
  reference pvVar9;
  remove_reference_t<std::__cxx11::basic_string<char>_> *this_01;
  remove_reference_t<std::__cxx11::basic_string<char>_> *args;
  char (*format_str) [29];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  format_args args_00;
  format_args args_01;
  string_view format_str_00;
  string_view format_str_01;
  allocator<const_kratos::IRNode_*> local_241;
  Var *local_240;
  Var **local_238;
  size_type local_230;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_228;
  v7 local_210 [32];
  string local_1f0;
  undefined1 local_1ca;
  allocator<const_kratos::IRNode_*> local_1c9;
  Var *local_1c8;
  Var **local_1c0;
  size_type local_1b8;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_1b0;
  remove_reference_t<std::__cxx11::basic_string<char>_> local_194;
  string local_170;
  undefined1 local_13c [8];
  uint32_t width_local;
  shared_ptr<kratos::Var> *var_local;
  VarExtend *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_120;
  basic_string_view<char> local_118;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_unsigned_int>
  local_108;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_unsigned_int>
  *local_d8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_unsigned_int>
  *vargs;
  remove_reference_t<std::__cxx11::basic_string<char>_> *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  string *local_b0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_a8;
  basic_string_view<char> local_98;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_88;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  char *local_68;
  string *local_60;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_unsigned_int>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_unsigned_int>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_unsigned_int>
  *local_10;
  
  local_13c._0_4_ = width;
  unique0x100004fe = var;
  var_local = (shared_ptr<kratos::Var> *)this;
  peVar5 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                     (&var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  Expr::Expr(&this->super_Expr,Extend,peVar5,(Var *)0x0);
  (this->super_Expr).super_Var.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_005c68f0;
  peVar5 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                      stack0xfffffffffffffec8);
  uVar1 = local_13c._0_4_;
  this->parent_ = peVar5;
  uVar3 = (*(this->parent_->super_IRNode)._vptr_IRNode[7])();
  if ((uint)uVar1 < uVar3) {
    local_1ca = 1;
    this_00 = (VarException *)__cxa_allocate_exception(0x10);
    (*(this->parent_->super_IRNode)._vptr_IRNode[0x1f])(&local_194.field_0x4);
    local_194._0_4_ = (*(this->parent_->super_IRNode)._vptr_IRNode[7])();
    local_b0 = &local_170;
    local_b8 = "Cannot extend {0} (width={1}) to {2}";
    local_c0 = &local_194.field_0x4;
    local_c8 = &local_194;
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_unsigned_int>
             *)local_13c;
    fmt::v7::make_args_checked<std::__cxx11::string,unsigned_int,unsigned_int&,char[37],char>
              (&local_108,(v7 *)"Cannot extend {0} (width={1}) to {2}",(char (*) [37])local_c0,
               local_c8,(remove_reference_t<unsigned_int> *)vargs,
               (remove_reference_t<unsigned_int_&> *)in_R9.values_);
    local_d8 = &local_108;
    local_118 = fmt::v7::to_string_view<char,_0>(local_b8);
    local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&this_local;
    local_30 = local_d8;
    local_20 = local_d8;
    local_10 = local_d8;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0x22d,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_d8);
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_120.values_;
    format_str_00.size_ = (size_t)this_local;
    format_str_00.data_ = (char *)local_118.size_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_170,(detail *)local_118.data_,format_str_00,args_00);
    local_1c8 = this->parent_;
    local_1c0 = &local_1c8;
    local_1b8 = 1;
    std::allocator<const_kratos::IRNode_*>::allocator(&local_1c9);
    __l_00._M_len = local_1b8;
    __l_00._M_array = (iterator)local_1c0;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              (&local_1b0,__l_00,&local_1c9);
    VarException::VarException(this_00,&local_170,&local_1b0);
    local_1ca = 0;
    __cxa_throw(this_00,&VarException::typeinfo,VarException::~VarException);
  }
  (this->super_Expr).super_Var.var_width_ = local_13c._0_4_;
  pbVar6 = Var::is_signed(this->parent_);
  (this->super_Expr).super_Var.is_signed_ = (bool)(*pbVar6 & 1);
  pvVar7 = Var::size(this->parent_);
  sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar7);
  if (sVar8 < 2) {
    pvVar7 = Var::size(this->parent_);
    pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar7);
    if ((*pvVar9 < 2) &&
       ((bVar2 = Var::explicit_array(this->parent_), !bVar2 ||
        (VVar4 = Var::type(this->parent_), VVar4 == ConstValue)))) {
      return;
    }
  }
  this_01 = (remove_reference_t<std::__cxx11::basic_string<char>_> *)__cxa_allocate_exception(0x10);
  args = this_01;
  (*(this->parent_->super_IRNode)._vptr_IRNode[0x1f])(local_210);
  local_60 = &local_1f0;
  local_68 = "Cannot extend an array ({0})";
  vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_210;
  local_88.named_args.data =
       (named_arg_info<char> *)
       fmt::v7::make_args_checked<std::__cxx11::string,char[29],char>
                 ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)"Cannot extend an array ({0})",(v7 *)vargs_1,format_str,args);
  local_78 = &local_88;
  local_98 = fmt::v7::to_string_view<char,_0>(local_68);
  local_50 = &local_a8;
  local_58 = local_78;
  local_48 = local_78;
  local_38 = local_78;
  local_40 = local_50;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_50,0xd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&local_78->string);
  args_01.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args_01.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_a8.field_1.values_;
  format_str_01.size_ = local_a8.desc_;
  format_str_01.data_ = (char *)local_98.size_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_1f0,(detail *)local_98.data_,format_str_01,args_01);
  local_240 = this->parent_;
  local_238 = &local_240;
  local_230 = 1;
  std::allocator<const_kratos::IRNode_*>::allocator(&local_241);
  __l._M_len = local_230;
  __l._M_array = (iterator)local_238;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            (&local_228,__l,&local_241);
  VarException::VarException((VarException *)this_01,&local_1f0,&local_228);
  __cxa_throw(this_01,&VarException::typeinfo,VarException::~VarException);
}

Assistant:

VarExtend::VarExtend(const std::shared_ptr<Var> &var, uint32_t width)
    : Expr(ExprOp::Extend, var.get(), nullptr), parent_(var.get()) {
    if (width < parent_->width()) {
        throw VarException(::format("Cannot extend {0} (width={1}) to {2}", parent_->to_string(),
                                    parent_->width(), width),
                           {parent_});
    }
    var_width_ = width;
    is_signed_ = parent_->is_signed();
    if (parent_->size().size() > 1 || parent_->size().front() > 1 ||
        (parent_->explicit_array() && parent_->type() != VarType::ConstValue)) {
        throw VarException(::format("Cannot extend an array ({0})", parent_->to_string()),
                           {parent_});
    }
}